

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::mul(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  TDigit x;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference puVar4;
  undefined1 local_a8 [8];
  CArbitraryInteger tmp_1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  const_iterator j;
  iterator currentDigit;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  const_iterator i;
  iterator firstDigit;
  allocator<unsigned_int> local_41;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)operand;
  local_38._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                         (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_40._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend
                         (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  std::allocator<unsigned_int>::allocator(&local_41);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_30,local_38,local_40,
             &local_41);
  std::allocator<unsigned_int>::~allocator(&local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  firstDigit._M_current._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,sVar2 + sVar3,
             (value_type *)&firstDigit);
  i._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                   );
  local_68._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  while( true ) {
    currentDigit._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
    bVar1 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&currentDigit);
    if (!bVar1) break;
    j = i;
    local_80._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      tmp_1._24_8_ = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=
                        (&local_80,
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&tmp_1.isNegative);
      if (!bVar1) break;
      CArbitraryInteger((CArbitraryInteger *)local_a8);
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_68);
      x = *puVar4;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_80);
      mulDigitDigit(this,x,*puVar4,(CArbitraryInteger *)local_a8);
      add(this,(iterator)j._M_current,(CArbitraryInteger *)local_a8);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)&j);
      ~CArbitraryInteger((CArbitraryInteger *)local_a8);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_68);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)&i);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return;
}

Assistant:

void CArbitraryInteger::mul( const CArbitraryInteger& operand )
{
	std::vector<value_type> tmp( cbegin(), cend() );
	clear();
	resize( tmp.size() + operand.size(), 0 );
	iterator firstDigit = begin();
	for( const_iterator i = tmp.cbegin(); i != tmp.cend(); ++i, ++firstDigit ) {
		iterator currentDigit = firstDigit;
		for( const_iterator j = operand.cbegin(); j != operand.cend(); ++j ) {
			CArbitraryInteger tmp;
			mulDigitDigit( *i, *j, tmp );
			add( currentDigit, tmp );
			++currentDigit;
		}
	}
}